

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O1

uint MurmurHash3(uint nHashSeed,Span<const_unsigned_char> vDataToHash)

{
  long lVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  puVar2 = vDataToHash.m_data;
  uVar3 = (uint)(vDataToHash.m_size >> 2);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      uVar5 = (*(int *)(puVar2 + uVar4 * 4) * 0x16a88000 |
              (uint)(*(int *)(puVar2 + uVar4 * 4) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ nHashSeed;
      nHashSeed = (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  lVar1 = (long)(int)uVar3;
  uVar5 = 0;
  uVar3 = 0;
  switch((uint)vDataToHash.m_size & 3) {
  case 3:
    uVar3 = (uint)puVar2[lVar1 * 4 + 2] << 0x10;
  case 2:
    uVar5 = uVar3 | (uint)puVar2[lVar1 * 4 + 1] << 8;
  case 1:
    nHashSeed = nHashSeed ^
                ((puVar2[lVar1 * 4] ^ uVar5) * 0x16a88000 |
                (puVar2[lVar1 * 4] ^ uVar5) * -0x3361d2af >> 0x11) * 0x1b873593;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar3 = nHashSeed ^ (uint)vDataToHash.m_size;
    uVar3 = (uVar3 >> 0x10 ^ uVar3) * -0x7a143595;
    uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
    return uVar3 >> 0x10 ^ uVar3;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int MurmurHash3(unsigned int nHashSeed, Span<const unsigned char> vDataToHash)
{
    // The following is MurmurHash3 (x86_32), see https://github.com/aappleby/smhasher/blob/master/src/MurmurHash3.cpp
    uint32_t h1 = nHashSeed;
    const uint32_t c1 = 0xcc9e2d51;
    const uint32_t c2 = 0x1b873593;

    const int nblocks = vDataToHash.size() / 4;

    //----------
    // body
    const uint8_t* blocks = vDataToHash.data();

    for (int i = 0; i < nblocks; ++i) {
        uint32_t k1 = ReadLE32(blocks + i*4);

        k1 *= c1;
        k1 = std::rotl(k1, 15);
        k1 *= c2;

        h1 ^= k1;
        h1 = std::rotl(h1, 13);
        h1 = h1 * 5 + 0xe6546b64;
    }

    //----------
    // tail
    const uint8_t* tail = vDataToHash.data() + nblocks * 4;

    uint32_t k1 = 0;

    switch (vDataToHash.size() & 3) {
        case 3:
            k1 ^= tail[2] << 16;
            [[fallthrough]];
        case 2:
            k1 ^= tail[1] << 8;
            [[fallthrough]];
        case 1:
            k1 ^= tail[0];
            k1 *= c1;
            k1 = std::rotl(k1, 15);
            k1 *= c2;
            h1 ^= k1;
    }

    //----------
    // finalization
    h1 ^= vDataToHash.size();
    h1 ^= h1 >> 16;
    h1 *= 0x85ebca6b;
    h1 ^= h1 >> 13;
    h1 *= 0xc2b2ae35;
    h1 ^= h1 >> 16;

    return h1;
}